

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_CHAIN(effect_handler_context_t *context)

{
  loc grid2;
  loc_conflict grid_00;
  loc_conflict grid2_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  _Bool _Var1;
  wchar_t dam_00;
  uint32_t uVar2;
  anon_enum_32 aVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  monster *pmVar6;
  source sVar7;
  ulong uStack_378;
  wchar_t dist;
  source src;
  monster *avail_mon [100];
  wchar_t flag;
  wchar_t avail_mon_num;
  wchar_t pick;
  loc_conflict cur;
  loc_conflict target;
  loc_conflict grid;
  wchar_t strikes;
  wchar_t k;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  dam_00 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  uVar2 = Rand_div(10);
  avail_mon_num = (player->grid).x;
  pick = (player->grid).y;
  sVar7 = source_player();
  src._0_8_ = sVar7.which;
  aVar3 = sVar7.what;
  for (grid.y = L'\0'; grid.y < L'd'; grid.y = grid.y + L'\x01') {
    avail_mon[(long)grid.y + -1] = (monster *)0x0;
  }
  grid.y = L'\0';
  while( true ) {
    uStack_378 = CONCAT44(0,aVar3);
    if (uVar2 + L'\x03' <= grid.y) {
      return true;
    }
    avail_mon[99]._4_4_ = 0;
    for (target.y = pick + L'\xfffffffb'; target.y <= pick + L'\x05'; target.y = target.y + L'\x01')
    {
      for (target.x = avail_mon_num + L'\xfffffffb'; target.x <= avail_mon_num + L'\x05';
          target.x = target.x + L'\x01') {
        grid2.y = target.y;
        grid2.x = target.x;
        wVar4 = distance((loc)_avail_mon_num,grid2);
        if ((((wVar4 < L'\x06') &&
             (grid_00.y = target.y, grid_00.x = target.x,
             _Var1 = square_in_bounds_fully((chunk *)cave,grid_00), _Var1)) &&
            (grid2_00.y = target.y, grid2_00.x = target.x,
            _Var1 = projectable((chunk *)cave,_avail_mon_num,grid2_00,L'H'), _Var1)) &&
           (grid_01.y = target.y, grid_01.x = target.x,
           pmVar6 = square_monster((chunk *)cave,grid_01), pmVar6 != (monster *)0x0)) {
          grid_02.y = target.y;
          grid_02.x = target.x;
          pmVar6 = square_monster((chunk *)cave,grid_02);
          avail_mon[(long)(int)avail_mon[99]._4_4_ + -1] = pmVar6;
          avail_mon[99]._4_4_ = avail_mon[99]._4_4_ + 1;
        }
      }
    }
    if (avail_mon[99]._4_4_ == 0) break;
    uVar5 = Rand_div(avail_mon[99]._4_4_);
    avail_mon_num = (avail_mon[(long)(int)uVar5 + -1]->grid).x;
    pick = (avail_mon[(long)(int)uVar5 + -1]->grid).y;
    pmVar6 = square_monster((chunk *)cave,_avail_mon_num);
    if (pmVar6 == (monster *)0x0) {
      return true;
    }
    sVar7.which = (anon_union_8_5_62f3dbed_for_which_conflict1)src._0_8_;
    sVar7._0_8_ = uStack_378;
    project(sVar7,L'\x01',_avail_mon_num,dam_00,context->subtype,L'H',L'\0','\0',(object *)0x0);
    pmVar6 = square_monster((chunk *)cave,_avail_mon_num);
    if (pmVar6 == avail_mon[(long)(int)uVar5 + -1]) {
      sVar7 = source_monster(avail_mon[(long)(int)uVar5 + -1]->midx);
      src._0_8_ = sVar7.which;
      aVar3 = sVar7.what;
    }
    else {
      sVar7 = source_grid((loc)_avail_mon_num);
      src._0_8_ = sVar7.which;
      aVar3 = sVar7.what;
    }
    grid.y = grid.y + L'\x01';
  }
  return true;
}

Assistant:

bool effect_handler_CHAIN(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int k, strikes = 2 + randint1(10);
	struct loc grid, target, cur = player->grid;
	int pick, avail_mon_num;
	int flag = PROJECT_STOP | PROJECT_KILL;
	struct monster *avail_mon[100];
	struct source src = source_player();

	/* Initialise */
	for (k = 0; k < 100; k++) {
		avail_mon[k] = NULL;
	}
	target = cur;

	/* Start striking */
	for (k = 0; k < strikes; k++) {
		/* No targets yet */
		avail_mon_num = 0;

		/* Find something in range */
		for (grid.y = cur.y - 5; grid.y <= cur.y + 5; grid.y++) {
			for (grid.x = cur.x - 5; grid.x <= cur.x + 5; grid.x++) {
				int dist = distance(cur, grid);

				/* Skip distant grids */
				if (dist > 5) continue;

				/* Skip grids that are out of bounds */
				if (!square_in_bounds_fully(cave, grid)) continue;

				/* Skip grids that are not projectable */
				if (!projectable(cave, cur, grid, flag)) continue;

				/* Skip grids with no monster (including player) */
				if (!square_monster(cave, grid)) continue;

				/* Record the monster */
				avail_mon[avail_mon_num++] = square_monster(cave, grid);
			}
		}

		/* Maybe we're at a dead end */
		if (!avail_mon_num)	return true;

		/* Pick a target... */
		pick = randint0(avail_mon_num);
		target = avail_mon[pick]->grid;

		/* Paranoia */
		if (!square_monster(cave, target)) return true;

		/* ...and hit it */
		project(src, 1, target, dam, context->subtype, flag, 0, 0, NULL);

		/* Set next source (current monster may be dead) */
		cur = target;
		if (square_monster(cave, cur) == avail_mon[pick]) {
			src = source_monster(avail_mon[pick]->midx);
		} else {
			src = source_grid(cur);
		}
	}

	return true;
}